

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fComputeShaderBuiltinVarTests.cpp
# Opt level: O0

deUint32 __thiscall
deqp::gles31::Functional::ComputeBuiltinVarCase::getProgram
          (ComputeBuiltinVarCase *this,UVec3 *localSize)

{
  bool bVar1;
  pointer ppVar2;
  ShaderProgram *pSVar3;
  RenderContext *renderCtx;
  ProgramSources *sources;
  TestLog *log;
  TestError *this_00;
  mapped_type *this_01;
  allocator<char> local_1a1;
  string local_1a0;
  undefined1 local_179;
  string local_178;
  ShaderSource local_158;
  ProgramSources local_130;
  undefined1 local_50 [8];
  ShaderProgramSp program;
  _Rb_tree_const_iterator<std::pair<const_tcu::Vector<unsigned_int,_3>,_de::SharedPtr<glu::ShaderProgram>_>_>
  local_38;
  iterator local_30;
  _Rb_tree_const_iterator<std::pair<const_tcu::Vector<unsigned_int,_3>,_de::SharedPtr<glu::ShaderProgram>_>_>
  local_28;
  const_iterator cachePos;
  UVec3 *localSize_local;
  ComputeBuiltinVarCase *this_local;
  
  cachePos._M_node = (_Base_ptr)localSize;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<tcu::Vector<unsigned_int,_3>,_de::SharedPtr<glu::ShaderProgram>,_deqp::gles31::Functional::LexicalCompareVec<unsigned_int,_3>,_std::allocator<std::pair<const_tcu::Vector<unsigned_int,_3>,_de::SharedPtr<glu::ShaderProgram>_>_>_>
       ::find(&this->m_progMap,localSize);
  std::
  _Rb_tree_const_iterator<std::pair<const_tcu::Vector<unsigned_int,_3>,_de::SharedPtr<glu::ShaderProgram>_>_>
  ::_Rb_tree_const_iterator(&local_28,&local_30);
  program.m_state =
       (SharedPtrStateBase *)
       std::
       map<tcu::Vector<unsigned_int,_3>,_de::SharedPtr<glu::ShaderProgram>,_deqp::gles31::Functional::LexicalCompareVec<unsigned_int,_3>,_std::allocator<std::pair<const_tcu::Vector<unsigned_int,_3>,_de::SharedPtr<glu::ShaderProgram>_>_>_>
       ::end(&this->m_progMap);
  std::
  _Rb_tree_const_iterator<std::pair<const_tcu::Vector<unsigned_int,_3>,_de::SharedPtr<glu::ShaderProgram>_>_>
  ::_Rb_tree_const_iterator(&local_38,(iterator *)&program.m_state);
  bVar1 = std::operator!=(&local_28,&local_38);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_tcu::Vector<unsigned_int,_3>,_de::SharedPtr<glu::ShaderProgram>_>_>
             ::operator->(&local_28);
    pSVar3 = de::SharedPtr<glu::ShaderProgram>::operator->(&ppVar2->second);
    this_local._4_4_ = glu::ShaderProgram::getProgram(pSVar3);
  }
  else {
    pSVar3 = (ShaderProgram *)operator_new(0xd0);
    local_179 = 1;
    renderCtx = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    glu::ProgramSources::ProgramSources(&local_130);
    genBuiltinVarSource(&local_178,&this->m_varName,this->m_varType,(UVec3 *)cachePos._M_node);
    glu::ComputeSource::ComputeSource((ComputeSource *)&local_158,&local_178);
    sources = glu::ProgramSources::operator<<(&local_130,&local_158);
    glu::ShaderProgram::ShaderProgram(pSVar3,renderCtx,sources);
    local_179 = 0;
    de::SharedPtr<glu::ShaderProgram>::SharedPtr((SharedPtr<glu::ShaderProgram> *)local_50,pSVar3);
    glu::ComputeSource::~ComputeSource((ComputeSource *)&local_158);
    std::__cxx11::string::~string((string *)&local_178);
    glu::ProgramSources::~ProgramSources(&local_130);
    log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    pSVar3 = de::SharedPtr<glu::ShaderProgram>::operator*((SharedPtr<glu::ShaderProgram> *)local_50)
    ;
    glu::operator<<(log,pSVar3);
    pSVar3 = de::SharedPtr<glu::ShaderProgram>::operator->
                       ((SharedPtr<glu::ShaderProgram> *)local_50);
    bVar1 = glu::ShaderProgram::isOk(pSVar3);
    if (!bVar1) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a0,"Compile failed",&local_1a1);
      tcu::TestError::TestError(this_00,&local_1a0);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    this_01 = std::
              map<tcu::Vector<unsigned_int,_3>,_de::SharedPtr<glu::ShaderProgram>,_deqp::gles31::Functional::LexicalCompareVec<unsigned_int,_3>,_std::allocator<std::pair<const_tcu::Vector<unsigned_int,_3>,_de::SharedPtr<glu::ShaderProgram>_>_>_>
              ::operator[](&this->m_progMap,(key_type *)cachePos._M_node);
    de::SharedPtr<glu::ShaderProgram>::operator=(this_01,(SharedPtr<glu::ShaderProgram> *)local_50);
    pSVar3 = de::SharedPtr<glu::ShaderProgram>::operator->
                       ((SharedPtr<glu::ShaderProgram> *)local_50);
    this_local._4_4_ = glu::ShaderProgram::getProgram(pSVar3);
    de::SharedPtr<glu::ShaderProgram>::~SharedPtr((SharedPtr<glu::ShaderProgram> *)local_50);
  }
  return this_local._4_4_;
}

Assistant:

deUint32 ComputeBuiltinVarCase::getProgram (const UVec3& localSize)
{
	LocalSizeProgramMap::const_iterator cachePos = m_progMap.find(localSize);
	if (cachePos != m_progMap.end())
		return cachePos->second->getProgram();
	else
	{
		ShaderProgramSp program(new ShaderProgram(m_context.getRenderContext(),
												  ProgramSources() << ComputeSource(genBuiltinVarSource(m_varName, m_varType, localSize))));

		// Log all compiled programs.
		m_testCtx.getLog() << *program;
		if (!program->isOk())
			throw tcu::TestError("Compile failed");

		m_progMap[localSize] = program;
		return program->getProgram();
	}
}